

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int nodeRowidIndex(Rtree *pRtree,RtreeNode *pNode,i64 iRowid,int *piIndex)

{
  ushort uVar1;
  i64 iVar2;
  uint iCell;
  
  uVar1 = *(ushort *)(pNode->zData + 2);
  iCell = 0;
  while( true ) {
    if ((ushort)(uVar1 << 8 | uVar1 >> 8) == iCell) {
      return 0x10b;
    }
    iVar2 = nodeGetRowid(pRtree,pNode,iCell);
    if (iVar2 == iRowid) break;
    iCell = iCell + 1;
  }
  *piIndex = iCell;
  return 0;
}

Assistant:

static int nodeRowidIndex(
  Rtree *pRtree, 
  RtreeNode *pNode, 
  i64 iRowid,
  int *piIndex
){
  int ii;
  int nCell = NCELL(pNode);
  assert( nCell<200 );
  for(ii=0; ii<nCell; ii++){
    if( nodeGetRowid(pRtree, pNode, ii)==iRowid ){
      *piIndex = ii;
      return SQLITE_OK;
    }
  }
  RTREE_IS_CORRUPT(pRtree);
  return SQLITE_CORRUPT_VTAB;
}